

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

void __thiscall
imrt::EvaluationFunction::generate_linear_system
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  Station *this_00;
  _List_node_base *p_Var1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  Matrix *pMVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  bool bVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int a;
  double dVar11;
  _List_node_base local_48;
  
  if (0 < this->nb_organs) {
    lVar8 = 0;
    bVar7 = false;
    do {
      if (0 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8]) {
        iVar9 = 0;
        do {
          if (bVar7) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," + ",3);
          }
          if (iVar9 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
          }
          dVar11 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
          if ((dVar11 != 0.0) || (NAN(dVar11))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"max(",4);
            poVar2 = std::ostream::_M_insert<double>
                               ((Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar8]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"- Z_",4);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar9);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"max(Z_",6);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-",1);
            poVar2 = std::ostream::_M_insert<double>
                               ((Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar8]);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", 0)^2",6);
          if (iVar9 == (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8] + -1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
          }
          iVar9 = iVar9 + 1;
          bVar7 = true;
        } while (iVar9 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar8]);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"/",1);
      std::ostream::operator<<
                ((ostream *)&std::cout,
                 (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->nb_organs);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  if (0 < this->nb_organs) {
    lVar8 = 0;
    do {
      if (0 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8]) {
        lVar10 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Z_",2);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
          p_Var3 = (_List_node_base *)Plan::get_stations_abi_cxx11_(p);
          p_Var5 = p_Var3->_M_next;
          if (p_Var5 != p_Var3) {
            bVar7 = false;
            iVar9 = 0;
            do {
              this_00 = (Station *)p_Var5[1]._M_next;
              pMVar4 = Station::getDepositionMatrix(this_00,(int)lVar8);
              if (0 < this_00->max_apertures) {
                a = 0;
                do {
                  Station::open_beamlets_abi_cxx11_
                            ((list<int,_std::allocator<int>_> *)&local_48,this_00,a);
                  p_Var1 = local_48._M_next;
                  if (local_48._M_next == &local_48) {
                    dVar11 = 0.0;
                  }
                  else {
                    dVar11 = 0.0;
                    p_Var6 = local_48._M_next;
                    do {
                      dVar11 = dVar11 + pMVar4->p[lVar10][*(int *)&p_Var6[1]._M_next];
                      p_Var6 = (((_List_base<int,_std::allocator<int>_> *)&p_Var6->_M_next)->_M_impl
                               )._M_node.super__List_node_base._M_next;
                    } while (p_Var6 != &local_48);
                  }
                  while (p_Var1 != &local_48) {
                    p_Var6 = p_Var1->_M_next;
                    operator_delete(p_Var1);
                    p_Var1 = p_Var6;
                  }
                  if (0.0 < dVar11) {
                    if (bVar7) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout," + ",3);
                    }
                    poVar2 = std::ostream::_M_insert<double>(dVar11);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar2," * I_",5);
                    std::ostream::operator<<((ostream *)poVar2,iVar9);
                    bVar7 = true;
                  }
                  iVar9 = iVar9 + 1;
                  a = a + 1;
                } while (a < this_00->max_apertures);
              }
              p_Var5 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                        &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            } while (p_Var5 != p_Var3);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          lVar10 = lVar10 + 1;
        } while (lVar10 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->nb_organs);
  }
  return;
}

Assistant:

void EvaluationFunction::generate_linear_system(const Plan& p, vector<double>& w, vector<double>& Zmin, vector<double>& Zmax){
	bool flag=false;
	for(int o=0; o<nb_organs; o++){
		double pen=0.0;
		for(int k=0; k<nb_voxels[o]; k++){
			if(flag) cout << " + ";
			flag = true;
			if(k==0) cout << "(";
			if(Zmin[o] == 0 )
				cout << "max(Z_" << o << "_" << k << "-" << Zmax[o] << ", 0)^2" ;
			else
				cout << "max(" << Zmin[o] << "- Z_" << o << "_" << k << ", 0)^2" ;
			if(k==nb_voxels[o]-1) cout << ")";
		}
		cout << "/" << nb_voxels[o];
	}
	cout << endl;

	for(int o=0; o<nb_organs; o++){
		for(int k=0; k<nb_voxels[o]; k++){
			cout << "Z_" << o << "_" << k << "=" ;
			int ap=0; //aperture variable id
			bool flag = false;
			for(auto s : p.get_stations()){
				const Matrix&  D = s->getDepositionMatrix(o);
				for(int a=0; a<s->getNbApertures(); a++){
					double ap_dose_per_intensity=0.0;
					for(auto b: s->open_beamlets(a)) ap_dose_per_intensity+=D(k,b);

					if (ap_dose_per_intensity>0.0){
						if(flag) cout << " + ";
						cout << ap_dose_per_intensity << " * I_" << ap;
						flag = true;

					}
					ap++;
				}
			}
			cout << endl;
		}
	}
}